

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fread.c
# Opt level: O3

size_t fread(void *__ptr,size_t __size,size_t __n,FILE *__stream)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  
  mtx_lock((mtx_t *)&__stream->_IO_save_base);
  iVar1 = _PDCLIB_prepread((_PDCLIB_file_t *)__stream);
  if (__n == 0 || iVar1 == -1) {
    sVar4 = 0;
  }
  else {
    sVar3 = 0;
    do {
      if (__size != 0) {
        sVar5 = 0;
        do {
          pcVar2 = __stream->_IO_buf_base;
          if (__stream->_IO_read_base == __stream->_IO_write_base) {
            if (pcVar2 == (char *)0x0) {
              iVar1 = _PDCLIB_fillbuffer((_PDCLIB_file_t *)__stream);
              sVar4 = sVar3;
              if (iVar1 != -1) {
                pcVar2 = __stream->_IO_buf_base;
                goto LAB_00104e7e;
              }
              goto LAB_00104ecd;
            }
LAB_00104e83:
            __stream->_IO_buf_base = pcVar2 + -1;
            pcVar2 = pcVar2 + (long)__stream + 0x3f;
          }
          else {
LAB_00104e7e:
            if (pcVar2 != (char *)0x0) goto LAB_00104e83;
            pcVar2 = __stream->_IO_read_base;
            __stream->_IO_read_base = pcVar2 + 1;
            pcVar2 = pcVar2 + (long)__stream->_IO_read_ptr;
          }
          *(char *)((long)__ptr + sVar5) = *pcVar2;
          sVar5 = sVar5 + 1;
        } while (__size != sVar5);
      }
      sVar3 = sVar3 + 1;
      __ptr = (void *)((long)__ptr + __size);
      sVar4 = __n;
    } while (sVar3 != __n);
  }
LAB_00104ecd:
  mtx_unlock((mtx_t *)&__stream->_IO_save_base);
  return sVar4;
}

Assistant:

size_t fread( void * _PDCLIB_restrict ptr, size_t size, size_t nmemb, struct _PDCLIB_file_t * _PDCLIB_restrict stream )
{
    char * dest = ( char * )ptr;
    size_t nmemb_i = 0;

    _PDCLIB_LOCK( stream->mtx );

    if ( _PDCLIB_prepread( stream ) != EOF )
    {
        for ( nmemb_i = 0; nmemb_i < nmemb; ++nmemb_i )
        {
            size_t size_i;

            /* TODO: For better performance, move from stream buffer
               to destination block-wise, not byte-wise.
            */
            for ( size_i = 0; size_i < size; ++size_i )
            {
                if ( _PDCLIB_CHECKBUFFER( stream ) == EOF )
                {
                    /* Could not read requested data */
                    _PDCLIB_UNLOCK( stream->mtx );
                    return nmemb_i;
                }

                dest[ nmemb_i * size + size_i ] = _PDCLIB_GETC( stream );
            }
        }
    }

    _PDCLIB_UNLOCK( stream->mtx );

    return nmemb_i;
}